

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O0

FT_Error raccess_guess_linux_double
                   (FT_Library library,FT_Stream stream,char *base_file_name,char **result_file_name
                   ,FT_Long *result_offset)

{
  FT_Memory memory_00;
  char *file_name;
  FT_Memory memory;
  FT_Error error;
  char *newpath;
  FT_Long *result_offset_local;
  char **result_file_name_local;
  char *base_file_name_local;
  FT_Stream stream_local;
  FT_Library library_local;
  
  memory_00 = library->memory;
  file_name = raccess_make_file_name(memory_00,base_file_name,"%");
  if (file_name == (char *)0x0) {
    library_local._4_4_ = 0x40;
  }
  else {
    library_local._4_4_ = raccess_guess_linux_double_from_file_name(library,file_name,result_offset)
    ;
    if (library_local._4_4_ == 0) {
      *result_file_name = file_name;
    }
    else {
      ft_mem_free(memory_00,file_name);
    }
  }
  return library_local._4_4_;
}

Assistant:

static FT_Error
  raccess_guess_linux_double( FT_Library  library,
                              FT_Stream   stream,
                              char       *base_file_name,
                              char      **result_file_name,
                              FT_Long    *result_offset )
  {
    char*      newpath;
    FT_Error   error;
    FT_Memory  memory;

    FT_UNUSED( stream );


    memory = library->memory;

    newpath = raccess_make_file_name( memory, base_file_name, "%" );
    if ( !newpath )
      return FT_THROW( Out_Of_Memory );

    error = raccess_guess_linux_double_from_file_name( library, newpath,
                                                       result_offset );
    if ( !error )
      *result_file_name = newpath;
    else
      FT_FREE( newpath );

    return error;
  }